

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O0

Vec_Int_t * Exp_Reverse(Vec_Int_t *p)

{
  Vec_Int_t *p_local;
  
  Vec_IntReverseOrder(p);
  return p;
}

Assistant:

static inline Vec_Int_t * Exp_Reverse( Vec_Int_t * p )
{
    Vec_IntReverseOrder( p );
    return p;
}